

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::BuildCamerasForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  uint uVar1;
  key_type *pkVar2;
  const_iterator cVar3;
  Logger *pLVar4;
  aiNode *this_00;
  key_type *__k;
  float fVar5;
  float fVar6;
  aiCamera *out;
  char *local_1c8 [4];
  aiNode *local_1a8 [47];
  
  pkVar2 = &((pNode->mCameras).
             super__Vector_base<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish)->mCamera;
  for (__k = &((pNode->mCameras).
               super__Vector_base<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
               ._M_impl.super__Vector_impl_data._M_start)->mCamera; __k != pkVar2; __k = __k + 1) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
            ::find(&(pParser->mCameraLibrary)._M_t,__k);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &(pParser->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[40]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [40])"Collada: Unable to find camera for ID \"");
      std::operator<<((ostream *)local_1a8,(string *)__k);
      std::operator<<((ostream *)local_1a8,"\". Skipping.");
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar4,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    else {
      if ((char)cVar3._M_node[3]._M_color == _S_black) {
        pLVar4 = DefaultLogger::get();
        Logger::warn(pLVar4,"Collada: Orthographic cameras are not supported.");
      }
      this_00 = (aiNode *)operator_new(0x438);
      aiCamera::aiCamera((aiCamera *)this_00);
      local_1a8[0] = this_00;
      if (this_00 != pTarget) {
        uVar1 = (pTarget->mName).length;
        (this_00->mName).length = uVar1;
        memcpy((this_00->mName).data,(pTarget->mName).data,(ulong)uVar1);
        (this_00->mName).data[uVar1] = '\0';
      }
      (this_00->mTransformation).b3 = 0.0;
      (this_00->mTransformation).b4 = 0.0;
      (this_00->mTransformation).c1 = -1.0;
      (this_00->mTransformation).c4 = *(float *)((long)&cVar3._M_node[3]._M_left + 4);
      (this_00->mTransformation).c3 = *(float *)&cVar3._M_node[3]._M_left;
      fVar5 = *(float *)((long)&cVar3._M_node[3]._M_parent + 4);
      if ((fVar5 != 1e+11) || (NAN(fVar5))) {
        (this_00->mTransformation).d1 = fVar5;
      }
      fVar5 = *(float *)&cVar3._M_node[3].field_0x4;
      if ((fVar5 != 1e+11) || (NAN(fVar5))) {
        (this_00->mTransformation).c2 = fVar5;
        if ((((*(float *)&cVar3._M_node[3]._M_parent != 1e+11) ||
             (NAN(*(float *)&cVar3._M_node[3]._M_parent))) &&
            (fVar5 = *(float *)((long)&cVar3._M_node[3]._M_parent + 4), fVar5 == 1e+11)) &&
           (!NAN(fVar5))) {
          fVar5 = tanf(*(float *)&cVar3._M_node[3].field_0x4 * 0.017453292);
          fVar6 = tanf(*(float *)&cVar3._M_node[3]._M_parent * 0.017453292);
          (local_1a8[0]->mTransformation).d1 = fVar5 / fVar6;
          this_00 = local_1a8[0];
        }
      }
      else {
        fVar5 = *(float *)((long)&cVar3._M_node[3]._M_parent + 4);
        if ((fVar5 != 1e+11) || (NAN(fVar5))) {
          fVar6 = *(float *)&cVar3._M_node[3]._M_parent;
          if ((fVar6 != 1e+11) || (NAN(fVar6))) {
            fVar6 = tanf(fVar6 * 0.017453292 * 0.5);
            fVar5 = atanf(fVar6 * fVar5);
            (local_1a8[0]->mTransformation).c2 = fVar5 * 57.29578 + fVar5 * 57.29578;
            this_00 = local_1a8[0];
          }
        }
      }
      (this_00->mTransformation).c2 = (this_00->mTransformation).c2 * 0.017453292;
      std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back
                (&this->mCameras,(value_type *)local_1a8);
    }
  }
  return;
}

Assistant:

void ColladaLoader::BuildCamerasForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    for (const Collada::CameraInstance& cid : pNode->mCameras) {
        // find the referred light
        ColladaParser::CameraLibrary::const_iterator srcCameraIt = pParser.mCameraLibrary.find(cid.mCamera);
        if (srcCameraIt == pParser.mCameraLibrary.end()) {
            ASSIMP_LOG_WARN_F("Collada: Unable to find camera for ID \"", cid.mCamera, "\". Skipping.");
            continue;
        }
        const Collada::Camera* srcCamera = &srcCameraIt->second;

        // orthographic cameras not yet supported in Assimp
        if (srcCamera->mOrtho) {
            ASSIMP_LOG_WARN("Collada: Orthographic cameras are not supported.");
        }

        // now fill our ai data structure
        aiCamera* out = new aiCamera();
        out->mName = pTarget->mName;

        // collada cameras point in -Z by default, rest is specified in node transform
        out->mLookAt = aiVector3D(0.f, 0.f, -1.f);

        // near/far z is already ok
        out->mClipPlaneFar = srcCamera->mZFar;
        out->mClipPlaneNear = srcCamera->mZNear;

        // ... but for the rest some values are optional
        // and we need to compute the others in any combination.
        if (srcCamera->mAspect != 10e10f) {
            out->mAspect = srcCamera->mAspect;
        }

        if (srcCamera->mHorFov != 10e10f) {
            out->mHorizontalFOV = srcCamera->mHorFov;

            if (srcCamera->mVerFov != 10e10f && srcCamera->mAspect == 10e10f) {
                out->mAspect = std::tan(AI_DEG_TO_RAD(srcCamera->mHorFov)) /
                    std::tan(AI_DEG_TO_RAD(srcCamera->mVerFov));
            }

        } else if (srcCamera->mAspect != 10e10f && srcCamera->mVerFov != 10e10f)  {
            out->mHorizontalFOV = 2.0f * AI_RAD_TO_DEG(std::atan(srcCamera->mAspect *
                std::tan(AI_DEG_TO_RAD(srcCamera->mVerFov) * 0.5f)));
        }

        // Collada uses degrees, we use radians
        out->mHorizontalFOV = AI_DEG_TO_RAD(out->mHorizontalFOV);

        // add to camera list
        mCameras.push_back(out);
    }
}